

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyevent.c
# Opt level: O0

void copy_cursor(int newx,int newy)

{
  uint uVar1;
  sbyte sVar2;
  int iVar4;
  int iVar5;
  uint *puVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  uint local_178;
  int local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  uint local_164;
  uint local_f8;
  int local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  uint local_b0;
  int srcRshift;
  uint newS;
  uint savedS;
  uint shS;
  uint *src32addr;
  uint *dst32addr;
  uint sdw_mask;
  uint postloop_mask;
  uint preloop_mask;
  int bb_fast;
  uint *OrigDstAddr;
  uint *OrigSrcAddr;
  int fwd;
  int src32rbit;
  int dst32rbit;
  int abc;
  UNSIGNED x32ia;
  UNSIGNED x32nbyt;
  UNSIGNED x32byta;
  uint local_40;
  uint mask;
  uint dstdata;
  uint dstold;
  uint srcRmask;
  int dst32lbit;
  int srcLshift;
  int src32lbit;
  int dstnumL;
  int num_lines_remaining;
  DLword *dstbase;
  DLword *srcbase;
  int newy_local;
  int newx_local;
  sbyte sVar3;
  
  dstbase = EmCursorBitMap68K;
  iVar4 = newy * ((int)displaywidth / 0x10);
  copy_cursor::sx = 0;
  copy_cursor::w = LastCursorClippingX;
  copy_cursor::h = LastCursorClippingY;
  copy_cursor::srcbpl = 0x10;
  copy_cursor::dstbpl = displaywidth;
  copy_cursor::op = 2;
  srcRmask = 0;
  dstdata = 0;
  OrigSrcAddr._4_4_ = 0;
  OrigDstAddr = (uint *)0x0;
  srcRshift = 0;
  local_b0 = 0;
  src32lbit = LastCursorClippingY;
  bVar8 = copy_cursor::backwardflg != 0;
  bVar9 = false;
  copy_cursor::dx = newx;
  if (copy_cursor::gray == 0) {
    if (bVar8) {
      uVar1 = (newx + LastCursorClippingX) - 1;
      if ((int)uVar1 < 0) {
        lVar7 = -(long)((int)(7 - uVar1) >> 3);
      }
      else {
        lVar7 = (long)((int)uVar1 >> 3);
      }
      x32nbyt = (long)DisplayRegion68k + lVar7 + (long)iVar4 * 2;
      _preloop_mask = (uint *)(x32nbyt - (x32nbyt & 3));
      fwd = (int)((x32nbyt & 3) << 3) + (uVar1 & 7);
      dstold = (fwd - LastCursorClippingX) + 1U & 0x1f;
      sdw_mask = -1 << (0x1fU - (char)fwd & 0x1f);
      if (dstold == 0) {
        local_f0 = 0xffffffff;
      }
      else {
        local_f0 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
      }
      dst32addr._4_4_ = local_f0;
      dst32addr._0_4_ = sdw_mask & local_f0;
      if ((LastCursorClippingX - fwd) + -1 < 1) {
        local_f4 = 0;
      }
      else {
        local_f4 = (LastCursorClippingX - fwd) + -1 >> 5;
      }
      srcLshift = local_f4;
      uVar1 = LastCursorClippingX - 1;
      if ((int)uVar1 < 0) {
        lVar7 = -(long)((int)(7 - uVar1) >> 3);
      }
      else {
        lVar7 = (long)((int)uVar1 >> 3);
      }
      x32nbyt = (long)EmCursorBitMap68K + lVar7;
      OrigDstAddr = (uint *)(x32nbyt - (x32nbyt & 3));
      OrigSrcAddr._4_4_ = (int)((x32nbyt & 3) << 3) + (uVar1 & 7);
      dst32lbit = (OrigSrcAddr._4_4_ - LastCursorClippingX) + 1 & 0x1f;
      local_b0 = dstold - dst32lbit;
      srcRmask = dst32lbit - dstold & 0x1f;
      if (srcRmask == 0) {
        local_f8 = 0;
      }
      else {
        local_f8 = -1 << (sbyte)srcRmask ^ 0xffffffff;
      }
      dstdata = local_f8;
    }
    else {
      if (newx < 0) {
        lVar7 = -(long)(7 - newx >> 3);
      }
      else {
        lVar7 = (long)(newx >> 3);
      }
      x32nbyt = (long)DisplayRegion68k + lVar7 + (long)iVar4 * 2;
      _preloop_mask = (uint *)(x32nbyt - (x32nbyt & 3));
      dstold = (int)((x32nbyt & 3) << 3) + (newx & 7U);
      fwd = (dstold + LastCursorClippingX) - 1 & 0x1f;
      if (dstold == 0) {
        local_e8 = 0xffffffff;
      }
      else {
        local_e8 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
      }
      sdw_mask = local_e8;
      dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
      dst32addr._0_4_ = local_e8 & dst32addr._4_4_;
      srcLshift = ((int)(dstold + LastCursorClippingX) >> 5) + -1;
      OrigDstAddr = (uint *)((long)EmCursorBitMap68K - ((ulong)EmCursorBitMap68K & 3));
      dst32lbit = (int)(((ulong)EmCursorBitMap68K & 3) << 3);
      OrigSrcAddr._4_4_ = (dst32lbit + LastCursorClippingX) - 1U & 0x1f;
      local_b0 = dstold - dst32lbit;
      srcRmask = dst32lbit - dstold & 0x1f;
      if (srcRmask == 0) {
        local_ec = 0xffffffff;
      }
      else {
        local_ec = -1 << (sbyte)srcRmask ^ 0xffffffff;
      }
      dstdata = local_ec;
    }
    local_b0 = local_b0 & 0x1f;
    _savedS = OrigDstAddr;
  }
  else {
    if (newx < 0) {
      lVar7 = -(long)(7 - newx >> 3);
    }
    else {
      lVar7 = (long)(newx >> 3);
    }
    x32nbyt = (long)DisplayRegion68k + lVar7 + (long)iVar4 * 2;
    _preloop_mask = (uint *)(x32nbyt - (x32nbyt & 3));
    dstold = (int)((x32nbyt & 3) << 3) + (newx & 7U);
    fwd = (dstold + LastCursorClippingX) - 1 & 0x1f;
    if (dstold == 0) {
      local_e4 = 0xffffffff;
    }
    else {
      local_e4 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
    }
    sdw_mask = local_e4;
    dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
    dst32addr._0_4_ = local_e4 & dst32addr._4_4_;
    srcLshift = ((int)(dstold + LastCursorClippingX) >> 5) + -1;
    bVar9 = (displaywidth & 0x1f) == 0;
    dst32lbit = 0;
    _savedS = OrigDstAddr;
  }
  do {
    src32addr = _preloop_mask;
    iVar4 = src32lbit + -1;
    if (src32lbit < 1) {
      return;
    }
    if (copy_cursor::gray == 0) {
      sVar2 = (sbyte)local_b0;
      sVar3 = (sbyte)srcRmask;
      if (bVar8) {
        if ((OrigSrcAddr._4_4_ < (uint)fwd) && ((int)(dstold + 1) < dst32lbit + copy_cursor::w)) {
          puVar6 = _savedS + -1;
          uVar1 = *_savedS;
          _savedS = _savedS + -2;
          newS = uVar1 >> sVar2 & dstdata | *puVar6 << sVar3;
          srcRshift = *puVar6 >> sVar2 & dstdata;
        }
        else {
          if (OrigSrcAddr._4_4_ < (uint)fwd) {
            newS = *_savedS >> sVar2 & dstdata;
          }
          else {
            newS = *_savedS << sVar3;
            srcRshift = *_savedS >> sVar2 & dstdata;
          }
          _savedS = _savedS + -1;
        }
        if (copy_cursor::src_comp != 0) {
          newS = newS ^ 0xffffffff;
        }
        if ((int)(dstold + copy_cursor::w) < 0x21) {
          x32byta._4_4_ = (uint)dst32addr;
        }
        else {
          local_40 = *_preloop_mask;
          uVar1 = local_40 & ~sdw_mask;
          switch(copy_cursor::op) {
          case 0:
            local_40 = newS;
            break;
          case 1:
            local_40 = newS & local_40;
            break;
          case 2:
            local_40 = newS | local_40;
            break;
          case 3:
            local_40 = newS ^ local_40;
          }
          *_preloop_mask = uVar1 | sdw_mask & local_40;
          src32addr = _preloop_mask + -1;
          if (dst32lbit == dstold) {
            if (copy_cursor::src_comp == 0) {
              switch(copy_cursor::op) {
              case 0:
                local_cc = srcLshift;
                while (local_cc = local_cc + -1, -1 < local_cc) {
                  *src32addr = *_savedS;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 1:
                local_cc = srcLshift;
                while (local_cc = local_cc + -1, -1 < local_cc) {
                  *src32addr = *_savedS & *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 2:
                local_cc = srcLshift;
                while (local_cc = local_cc + -1, -1 < local_cc) {
                  *src32addr = *_savedS | *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 3:
                local_cc = srcLshift;
                while (local_cc = local_cc + -1, -1 < local_cc) {
                  *src32addr = *_savedS ^ *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
              }
            }
            else {
              switch(copy_cursor::op) {
              case 0:
                local_c8 = srcLshift;
                while (local_c8 = local_c8 + -1, -1 < local_c8) {
                  *src32addr = *_savedS ^ 0xffffffff;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 1:
                local_c8 = srcLshift;
                while (local_c8 = local_c8 + -1, -1 < local_c8) {
                  *src32addr = (*_savedS ^ 0xffffffff) & *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 2:
                local_c8 = srcLshift;
                while (local_c8 = local_c8 + -1, -1 < local_c8) {
                  *src32addr = *_savedS ^ 0xffffffff | *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 3:
                local_c8 = srcLshift;
                while (local_c8 = local_c8 + -1, -1 < local_c8) {
                  *src32addr = *_savedS ^ 0xffffffff ^ *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
              }
            }
          }
          else if (copy_cursor::src_comp == 0) {
            switch(copy_cursor::op) {
            case 0:
              local_d4 = srcLshift;
              while (local_d4 = local_d4 + -1, -1 < local_d4) {
                uVar1 = srcRshift | *_savedS << sVar3;
                srcRshift = *_savedS >> sVar2;
                *src32addr = uVar1;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
              break;
            case 1:
              local_d4 = srcLshift;
              while (local_d4 = local_d4 + -1, -1 < local_d4) {
                uVar1 = srcRshift | *_savedS << sVar3;
                srcRshift = *_savedS >> sVar2;
                *src32addr = uVar1 & *src32addr;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
              break;
            case 2:
              local_d4 = srcLshift;
              while (local_d4 = local_d4 + -1, -1 < local_d4) {
                uVar1 = srcRshift | *_savedS << sVar3;
                srcRshift = *_savedS >> sVar2;
                *src32addr = uVar1 | *src32addr;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
              break;
            case 3:
              local_d4 = srcLshift;
              while (local_d4 = local_d4 + -1, -1 < local_d4) {
                uVar1 = srcRshift | *_savedS << sVar3;
                srcRshift = *_savedS >> sVar2;
                *src32addr = uVar1 ^ *src32addr;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
            }
          }
          else {
            switch(copy_cursor::op) {
            case 0:
              local_d0 = srcLshift;
              while (local_d0 = local_d0 + -1, -1 < local_d0) {
                uVar1 = srcRshift | *_savedS << sVar3;
                srcRshift = *_savedS >> sVar2;
                *src32addr = uVar1 ^ 0xffffffff;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
              break;
            case 1:
              local_d0 = srcLshift;
              while (local_d0 = local_d0 + -1, -1 < local_d0) {
                uVar1 = srcRshift | *_savedS << sVar3;
                srcRshift = *_savedS >> sVar2;
                *src32addr = (uVar1 ^ 0xffffffff) & *src32addr;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
              break;
            case 2:
              local_d0 = srcLshift;
              while (local_d0 = local_d0 + -1, -1 < local_d0) {
                uVar1 = srcRshift | *_savedS << sVar3;
                srcRshift = *_savedS >> sVar2;
                *src32addr = uVar1 ^ 0xffffffff | *src32addr;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
              break;
            case 3:
              local_d0 = srcLshift;
              while (local_d0 = local_d0 + -1, -1 < local_d0) {
                uVar1 = srcRshift | *_savedS << sVar3;
                srcRshift = *_savedS >> sVar2;
                *src32addr = uVar1 ^ 0xffffffff ^ *src32addr;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
            }
          }
          if (dstold == 0) goto LAB_00146781;
          if ((uint)dst32lbit < dstold) {
            newS = srcRshift;
          }
          else {
            newS = srcRshift | *_savedS << sVar3;
          }
          if (copy_cursor::src_comp != 0) {
            newS = newS ^ 0xffffffff;
          }
          x32byta._4_4_ = dst32addr._4_4_;
        }
        goto LAB_001466ed;
      }
      if ((dstold < (uint)dst32lbit) && (0x20 < dst32lbit + copy_cursor::w)) {
        puVar6 = _savedS + 1;
        uVar1 = *_savedS;
        _savedS = _savedS + 2;
        newS = uVar1 << sVar3 | *puVar6 >> sVar2 & dstdata;
        srcRshift = *puVar6 << sVar3 & (dstdata ^ 0xffffffff);
      }
      else {
        if (dstold < (uint)dst32lbit) {
          newS = *_savedS << sVar3;
        }
        else {
          newS = *_savedS >> sVar2 & dstdata;
          srcRshift = *_savedS << sVar3 & (dstdata ^ 0xffffffff);
        }
        _savedS = _savedS + 1;
      }
      if (copy_cursor::src_comp != 0) {
        newS = newS ^ 0xffffffff;
      }
      if ((int)(dstold + copy_cursor::w) < 0x21) {
        x32byta._4_4_ = (uint)dst32addr;
        goto LAB_001466ed;
      }
      local_40 = *_preloop_mask;
      uVar1 = local_40 & ~sdw_mask;
      switch(copy_cursor::op) {
      case 0:
        local_40 = newS;
        break;
      case 1:
        local_40 = newS & local_40;
        break;
      case 2:
        local_40 = newS | local_40;
        break;
      case 3:
        local_40 = newS ^ local_40;
      }
      *_preloop_mask = uVar1 | sdw_mask & local_40;
      src32addr = _preloop_mask + 1;
      if (dst32lbit == dstold) {
        if (copy_cursor::src_comp == 0) {
          switch(copy_cursor::op) {
          case 0:
            local_bc = srcLshift;
            while (local_bc = local_bc + -1, -1 < local_bc) {
              *src32addr = *_savedS;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 1:
            local_bc = srcLshift;
            while (local_bc = local_bc + -1, -1 < local_bc) {
              *src32addr = *_savedS & *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 2:
            local_bc = srcLshift;
            while (local_bc = local_bc + -1, -1 < local_bc) {
              *src32addr = *_savedS | *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 3:
            local_bc = srcLshift;
            while (local_bc = local_bc + -1, -1 < local_bc) {
              *src32addr = *_savedS ^ *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
          }
        }
        else {
          switch(copy_cursor::op) {
          case 0:
            local_b8 = srcLshift;
            while (local_b8 = local_b8 + -1, -1 < local_b8) {
              *src32addr = *_savedS ^ 0xffffffff;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 1:
            local_b8 = srcLshift;
            while (local_b8 = local_b8 + -1, -1 < local_b8) {
              *src32addr = (*_savedS ^ 0xffffffff) & *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 2:
            local_b8 = srcLshift;
            while (local_b8 = local_b8 + -1, -1 < local_b8) {
              *src32addr = *_savedS ^ 0xffffffff | *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 3:
            local_b8 = srcLshift;
            while (local_b8 = local_b8 + -1, -1 < local_b8) {
              *src32addr = *_savedS ^ 0xffffffff ^ *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
          }
        }
      }
      else if (copy_cursor::src_comp == 0) {
        switch(copy_cursor::op) {
        case 0:
          local_c4 = srcLshift;
          while (local_c4 = local_c4 + -1, -1 < local_c4) {
            uVar1 = srcRshift | *_savedS >> sVar2;
            srcRshift = *_savedS << sVar3;
            *src32addr = uVar1;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
          break;
        case 1:
          local_c4 = srcLshift;
          while (local_c4 = local_c4 + -1, -1 < local_c4) {
            uVar1 = srcRshift | *_savedS >> sVar2;
            srcRshift = *_savedS << sVar3;
            *src32addr = uVar1 & *src32addr;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
          break;
        case 2:
          local_c4 = srcLshift;
          while (local_c4 = local_c4 + -1, -1 < local_c4) {
            uVar1 = srcRshift | *_savedS >> sVar2;
            srcRshift = *_savedS << sVar3;
            *src32addr = uVar1 | *src32addr;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
          break;
        case 3:
          local_c4 = srcLshift;
          while (local_c4 = local_c4 + -1, -1 < local_c4) {
            uVar1 = srcRshift | *_savedS >> sVar2;
            srcRshift = *_savedS << sVar3;
            *src32addr = uVar1 ^ *src32addr;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
        }
      }
      else {
        switch(copy_cursor::op) {
        case 0:
          local_c0 = srcLshift;
          while (local_c0 = local_c0 + -1, -1 < local_c0) {
            uVar1 = srcRshift | *_savedS >> sVar2;
            srcRshift = *_savedS << sVar3;
            *src32addr = uVar1 ^ 0xffffffff;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
          break;
        case 1:
          local_c0 = srcLshift;
          while (local_c0 = local_c0 + -1, -1 < local_c0) {
            uVar1 = srcRshift | *_savedS >> sVar2;
            srcRshift = *_savedS << sVar3;
            *src32addr = (uVar1 ^ 0xffffffff) & *src32addr;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
          break;
        case 2:
          local_c0 = srcLshift;
          while (local_c0 = local_c0 + -1, -1 < local_c0) {
            uVar1 = srcRshift | *_savedS >> sVar2;
            srcRshift = *_savedS << sVar3;
            *src32addr = uVar1 ^ 0xffffffff | *src32addr;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
          break;
        case 3:
          local_c0 = srcLshift;
          while (local_c0 = local_c0 + -1, -1 < local_c0) {
            uVar1 = srcRshift | *_savedS >> sVar2;
            srcRshift = *_savedS << sVar3;
            *src32addr = uVar1 ^ 0xffffffff ^ *src32addr;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
        }
      }
      if (fwd != 0x1f) {
        if ((uint)fwd < OrigSrcAddr._4_4_) {
          newS = srcRshift;
        }
        else {
          newS = srcRshift | *_savedS >> sVar2 & dstdata;
        }
        if (copy_cursor::src_comp != 0) {
          newS = newS ^ 0xffffffff;
        }
        x32byta._4_4_ = dst32addr._4_4_;
        goto LAB_001466ed;
      }
    }
    else {
      srcRmask = dst32lbit - dstold & 0xf;
      uVar1 = CONCAT22(*dstbase,*dstbase) << (sbyte)srcRmask;
      newS = uVar1 >> 0x10 | uVar1;
      if (copy_cursor::src_comp != 0) {
        newS = newS ^ 0xffffffff;
      }
      if ((int)(dstold + copy_cursor::w) < 0x21) {
        x32byta._4_4_ = (uint)dst32addr;
      }
      else {
        local_40 = *_preloop_mask;
        uVar1 = local_40 & ~sdw_mask;
        switch(copy_cursor::op) {
        case 0:
          local_40 = newS;
          break;
        case 1:
          local_40 = newS & local_40;
          break;
        case 2:
          local_40 = newS | local_40;
          break;
        case 3:
          local_40 = newS ^ local_40;
        }
        *_preloop_mask = local_40 & sdw_mask | uVar1;
        src32addr = _preloop_mask + 1;
        switch(copy_cursor::op) {
        case 0:
          local_b4 = srcLshift;
          while (local_b4 = local_b4 + -1, -1 < local_b4) {
            *src32addr = newS;
            src32addr = src32addr + 1;
          }
          break;
        case 1:
          local_b4 = srcLshift;
          while (local_b4 = local_b4 + -1, -1 < local_b4) {
            *src32addr = newS & *src32addr;
            src32addr = src32addr + 1;
          }
          break;
        case 2:
          local_b4 = srcLshift;
          while (local_b4 = local_b4 + -1, -1 < local_b4) {
            *src32addr = newS | *src32addr;
            src32addr = src32addr + 1;
          }
          break;
        case 3:
          local_b4 = srcLshift;
          while (local_b4 = local_b4 + -1, -1 < local_b4) {
            *src32addr = newS ^ *src32addr;
            src32addr = src32addr + 1;
          }
        }
        if (fwd == 0x1f) goto LAB_00146781;
        x32byta._4_4_ = dst32addr._4_4_;
      }
LAB_001466ed:
      local_40 = *src32addr;
      uVar1 = local_40 & ~x32byta._4_4_;
      switch(copy_cursor::op) {
      case 0:
        local_40 = newS;
        break;
      case 1:
        local_40 = newS & local_40;
        break;
      case 2:
        local_40 = newS | local_40;
        break;
      case 3:
        local_40 = newS ^ local_40;
      }
      *src32addr = uVar1 | x32byta._4_4_ & local_40;
    }
LAB_00146781:
    iVar5 = copy_cursor::dstbpl >> 5;
    src32lbit = iVar4;
    if (copy_cursor::gray == 0) {
      iVar4 = copy_cursor::srcbpl >> 5;
      if (bVar8) {
        if (bVar9) {
          lVar7 = (long)iVar5 * 4;
        }
        else {
          uVar1 = copy_cursor::dstbpl + fwd;
          if ((int)uVar1 < 0) {
            lVar7 = (long)((int)(0x1f - uVar1) >> 5) * -4;
          }
          else {
            lVar7 = (long)((int)dstold >> 5) * 4;
          }
          fwd = uVar1 & 0x1f;
          dstold = (fwd - copy_cursor::w) + 1U & 0x1f;
          sdw_mask = -1 << (0x1fU - (char)fwd & 0x1f);
          if (dstold == 0) {
            local_170 = 0xffffffff;
          }
          else {
            local_170 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
          }
          dst32addr._4_4_ = local_170;
          dst32addr._0_4_ = sdw_mask & local_170;
          if ((copy_cursor::w - fwd) + -1 < 1) {
            local_174 = 0;
          }
          else {
            local_174 = (copy_cursor::w - fwd) + -1 >> 5;
          }
          srcLshift = local_174;
        }
        src32addr = (uint *)((long)_preloop_mask + lVar7);
        if (bVar9) {
          lVar7 = (long)iVar4 * 4;
        }
        else {
          uVar1 = copy_cursor::srcbpl + OrigSrcAddr._4_4_;
          if ((int)uVar1 < 0) {
            lVar7 = (long)((int)(0x1f - uVar1) >> 5) * -4;
          }
          else {
            lVar7 = (long)((int)uVar1 >> 5) * 4;
          }
          OrigSrcAddr._4_4_ = uVar1 & 0x1f;
          dst32lbit = (OrigSrcAddr._4_4_ - copy_cursor::w) + 1 & 0x1f;
          local_b0 = dstold - dst32lbit & 0x1f;
          srcRmask = dst32lbit - dstold & 0x1f;
          if (srcRmask == 0) {
            local_178 = 0;
          }
          else {
            local_178 = -1 << (sbyte)srcRmask ^ 0xffffffff;
          }
          dstdata = local_178;
        }
        _savedS = (uint *)((long)OrigDstAddr + lVar7);
        _preloop_mask = src32addr;
        OrigDstAddr = _savedS;
      }
      else {
        if (!bVar9) {
          iVar5 = (int)(copy_cursor::dstbpl + dstold) >> 5;
          dstold = copy_cursor::dstbpl + dstold & 0x1f;
          fwd = (dstold + copy_cursor::w) - 1 & 0x1f;
          if (dstold == 0) {
            local_168 = 0xffffffff;
          }
          else {
            local_168 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
          }
          sdw_mask = local_168;
          dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
          dst32addr._0_4_ = local_168 & dst32addr._4_4_;
          srcLshift = ((int)(dstold + copy_cursor::w) >> 5) + -1;
        }
        _preloop_mask = _preloop_mask + iVar5;
        if (!bVar9) {
          iVar4 = copy_cursor::srcbpl + dst32lbit >> 5;
          dst32lbit = copy_cursor::srcbpl + dst32lbit & 0x1f;
          OrigSrcAddr._4_4_ = (dst32lbit + copy_cursor::w) - 1U & 0x1f;
          local_b0 = dstold - dst32lbit & 0x1f;
          srcRmask = dst32lbit - dstold & 0x1f;
          if (srcRmask == 0) {
            local_16c = 0xffffffff;
          }
          else {
            local_16c = -1 << (sbyte)srcRmask ^ 0xffffffff;
          }
          dstdata = local_16c;
        }
        OrigDstAddr = OrigDstAddr + iVar4;
        _savedS = OrigDstAddr;
      }
    }
    else {
      if (!bVar9) {
        iVar5 = (int)(copy_cursor::dstbpl + dstold) >> 5;
        dstold = copy_cursor::dstbpl + dstold & 0x1f;
        fwd = (dstold + copy_cursor::w) - 1 & 0x1f;
        if (dstold == 0) {
          local_164 = 0xffffffff;
        }
        else {
          local_164 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
        }
        sdw_mask = local_164;
        dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
        dst32addr._0_4_ = local_164 & dst32addr._4_4_;
        srcLshift = ((int)(dstold + copy_cursor::w) >> 5) + -1;
      }
      _preloop_mask = _preloop_mask + iVar5;
      copy_cursor::curr_gray_line = copy_cursor::curr_gray_line + 1;
      if (copy_cursor::curr_gray_line < copy_cursor::num_gray) {
        dstbase = dstbase + 1;
      }
      else {
        copy_cursor::curr_gray_line = 0;
        dstbase = dstbase + -(long)(copy_cursor::num_gray + -1);
      }
    }
  } while( true );
}

Assistant:

void copy_cursor(int newx, int newy)
{
  DLword *srcbase, *dstbase;
  static int sx, dx, w, h, srcbpl, dstbpl, backwardflg = 0;
  static int src_comp = 0, op = 0, gray = 0, num_gray = 0, curr_gray_line = 0;
  extern DLword *EmCursorBitMap68K;
  /* copy cursor image */
  srcbase = EmCursorBitMap68K;
  dstbase = DisplayRegion68k + (newy * DLWORD_PERLINE);
  sx = 0;
  dx = newx;
  w = LastCursorClippingX;
  h = LastCursorClippingY;

  srcbpl = HARD_CURSORWIDTH;
  dstbpl = displaywidth;
  op = 2; /* OR-in */
  new_bitblt_code;
#ifdef DISPLAYBUFFER
  flush_display_region(dx, newy, w, h);
#endif
}